

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void predict_inter_block(AV1_COMMON *cm,DecoderCodingBlock *dcb,BLOCK_SIZE bsize)

{
  macroblockd_plane *planes;
  int *piVar1;
  uint8_t uVar2;
  char ref_frame;
  BLOCK_SIZE BVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MB_MODE_INFO *pMVar10;
  long lVar11;
  int iVar12;
  uint bh;
  RefCntBuffer *pRVar13;
  scale_factors *sf;
  byte bVar14;
  long lVar15;
  uint uVar23;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  uint8_t *puVar21;
  uint uVar22;
  MB_MODE_INFO *pMVar24;
  MB_MODE_INFO **ppMVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int j;
  int j_1;
  long lVar29;
  int ref;
  ulong uVar30;
  macroblockd_plane *pmVar31;
  byte bVar32;
  int dst_stride2 [3];
  int dst_stride1 [3];
  int local_190 [4];
  int dst_height1 [3];
  int dst_width2 [3];
  int dst_width1 [3];
  build_prediction_ctxt local_150;
  uint8_t *dst_buf2 [3];
  uint8_t *dst_buf1 [3];
  undefined1 local_e0 [24];
  int local_c8;
  int local_c4;
  int local_c0;
  
  pMVar24 = *(dcb->xd).mi;
  uVar2 = cm->seq_params->monochrome;
  iVar16 = (dcb->xd).mi_row;
  iVar5 = (dcb->xd).mi_col;
  for (uVar30 = 0; uVar30 <= ('\0' < pMVar24->ref_frame[1]); uVar30 = uVar30 + 1) {
    ref_frame = pMVar24->ref_frame[uVar30];
    if ('\0' < ref_frame) {
      pRVar13 = get_ref_frame_buf(cm,ref_frame);
      sf = get_ref_scale_factors_const(cm,ref_frame);
      (dcb->xd).block_ref_scale_factors[uVar30] = sf;
      av1_setup_pre_planes
                (&dcb->xd,(int)uVar30,&pRVar13->buf,iVar16,iVar5,sf,(uint)(uVar2 == '\0') * 2 + 1);
    }
  }
  uVar2 = cm->seq_params->monochrome;
  planes = (dcb->xd).plane;
  puVar21 = &(dcb->xd).plane[0].height;
  lVar29 = 0;
  while (((ulong)(uVar2 == '\0') * 2 + 1 != lVar29 &&
         ((lVar29 == 0 || ((dcb->xd).is_chroma_ref == true))))) {
    dec_build_inter_predictors
              (cm,dcb,(int)lVar29,*(dcb->xd).mi,0,(uint)puVar21[-1],(uint)*puVar21,iVar5 << 2,
               iVar16 << 2);
    pMVar10 = *(dcb->xd).mi;
    if (('\0' < pMVar10->ref_frame[0]) &&
       (((pMVar10->ref_frame[1] == '\0' && (0xf8 < (byte)(pMVar10->bsize - BLOCK_32X64))) &&
        (0xfb < (byte)(pMVar10->mode - 0x11))))) {
      local_e0._0_8_ = (dcb->xd).plane[0].dst.buf;
      local_e0._8_8_ = (dcb->xd).plane[1].dst.buf;
      local_e0._16_8_ = (dcb->xd).plane[2].dst.buf;
      local_c8 = (dcb->xd).plane[0].dst.stride;
      local_c4 = (dcb->xd).plane[1].dst.stride;
      local_c0 = (dcb->xd).plane[2].dst.stride;
      av1_build_interintra_predictor
                (cm,&dcb->xd,((buf_2d *)(puVar21 + -0x99))->buf,*(int *)(puVar21 + -0x81),
                 (BUFFER_SET *)local_e0,(int)lVar29,bsize);
    }
    lVar29 = lVar29 + 1;
    puVar21 = puVar21 + 0xa30;
  }
  if (pMVar24->motion_mode == '\x01') {
    uVar2 = cm->seq_params->monochrome;
    dst_stride1[2] = 0x80;
    dst_stride1[0] = 0x80;
    dst_stride1[1] = 0x80;
    dst_stride2[2] = 0x80;
    dst_stride2[0] = 0x80;
    dst_stride2[1] = 0x80;
    dst_width1[2] = 0x80;
    dst_width1[0] = 0x80;
    dst_width1[1] = 0x80;
    dst_width2[2] = 0x80;
    dst_width2[0] = 0x80;
    dst_width2[1] = 0x80;
    dst_height1[2] = 0x80;
    dst_height1[0] = 0x80;
    dst_height1[1] = 0x80;
    local_190[2] = 0x80;
    local_190[0] = 0x80;
    local_190[1] = 0x80;
    av1_setup_obmc_dst_bufs(&dcb->xd,dst_buf1,dst_buf2);
    ppMVar25 = (dcb->xd).mi;
    if ((dcb->xd).up_available == true) {
      bVar14 = (dcb->xd).height;
      iVar16 = 0x100;
      if (bVar14 < 0x10) {
        iVar16 = (uint)bVar14 << 4;
      }
      iVar16 = (uint)bVar14 * 0x20 - iVar16;
      piVar1 = &(dcb->xd).mb_to_bottom_edge;
      *piVar1 = *piVar1 + iVar16;
      local_150.tmp_width = dst_width1;
      local_150.tmp_height = dst_height1;
      local_150.tmp_stride = dst_stride1;
      local_150.mb_to_far_edge = (dcb->xd).mb_to_right_edge;
      iVar5 = max_neighbor_obmc[""[(*ppMVar25)->bsize]];
      uVar22 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
      uVar27 = (dcb->xd).mi_col;
      lVar15 = (long)(int)uVar27;
      lVar29 = (long)(dcb->xd).mi_stride;
      iVar17 = (dcb->xd).width + uVar27;
      iVar26 = (cm->mi_params).mi_cols;
      if (iVar26 <= iVar17) {
        iVar17 = iVar26;
      }
      iVar26 = 0;
      uVar28 = uVar27;
      local_150.cm = cm;
      local_150.tmp_buf = dst_buf1;
      local_150.dcb = dcb;
      while (((int)uVar28 < iVar17 && (iVar26 < iVar5))) {
        bVar14 = 0x10;
        if ((0x1f07ffUL >> ((ulong)ppMVar25[((int)uVar28 - lVar29) - lVar15]->bsize & 0x3f) & 1) !=
            0) {
          bVar14 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [ppMVar25[((int)uVar28 - lVar29) - lVar15]->bsize];
        }
        lVar11 = ((int)uVar28 - lVar29) - lVar15;
        uVar23 = uVar28 & 0xfffffffe;
        uVar19 = (uint)bVar14;
        if (bVar14 == 1) {
          uVar19 = 2;
          uVar28 = uVar23;
          lVar11 = (((long)(int)uVar23 + 1) - lVar29) - lVar15;
        }
        pMVar24 = ppMVar25[lVar11];
        if (((pMVar24->field_0xa7 & 0x80) != 0) || ('\0' < pMVar24->ref_frame[0])) {
          uVar23._0_1_ = (dcb->xd).width;
          uVar23._1_1_ = (dcb->xd).height;
          uVar23._2_2_ = *(undefined2 *)&(dcb->xd).field_0x2076;
          if ((byte)uVar19 <= (byte)(undefined1)uVar23) {
            uVar23 = uVar19;
          }
          iVar6 = (dcb->xd).mi_col;
          memcpy((MB_MODE_INFO *)local_e0,pMVar24,0xb0);
          av1_setup_build_prediction_by_above_pred
                    (&dcb->xd,uVar28 - uVar27,(uint8_t)uVar23,(MB_MODE_INFO *)local_e0,&local_150,
                     uVar22);
          iVar7 = (dcb->xd).mi_row;
          BVar3 = (*(dcb->xd).mi)->bsize;
          bVar14 = block_size_high[BVar3];
          pmVar31 = planes;
          for (uVar30 = 0; uVar22 != uVar30; uVar30 = uVar30 + 1) {
            iVar8 = pmVar31->subsampling_x;
            iVar9 = pmVar31->subsampling_y;
            iVar12 = av1_skip_u4x4_pred_in_obmc(BVar3,pmVar31,0);
            if (iVar12 == 0) {
              bVar20 = (char)iVar9 + 1;
              uVar18 = (uint)(bVar14 >> (bVar20 & 0x1f));
              bh = 0x40 >> (bVar20 & 0x1f);
              if (uVar18 < bh) {
                bh = uVar18;
              }
              if (uVar18 < 4) {
                bh = 4;
              }
              dec_build_inter_predictors
                        (local_150.cm,(DecoderCodingBlock *)local_150.dcb,(int)uVar30,
                         (MB_MODE_INFO *)local_e0,1,((uVar23 & 0xff) << 2) >> ((byte)iVar8 & 0x1f),
                         bh,(iVar6 + (uVar28 - uVar27)) * 4,iVar7 << 2);
            }
            pmVar31 = pmVar31 + 1;
          }
          iVar26 = iVar26 + 1;
        }
        uVar28 = uVar28 + uVar19;
      }
      (dcb->xd).mb_to_left_edge = (dcb->xd).mi_col * -0x20;
      (dcb->xd).mb_to_right_edge = local_150.mb_to_far_edge;
      piVar1 = &(dcb->xd).mb_to_bottom_edge;
      *piVar1 = *piVar1 - iVar16;
      ppMVar25 = (dcb->xd).mi;
    }
    uVar27 = (dcb->xd).mi_row;
    if ((dcb->xd).left_available == true) {
      bVar14 = (dcb->xd).width;
      iVar16 = 0x100;
      if (bVar14 < 0x10) {
        iVar16 = (uint)bVar14 << 4;
      }
      iVar16 = (uint)bVar14 * 0x20 - iVar16;
      piVar1 = &(dcb->xd).mb_to_right_edge;
      *piVar1 = *piVar1 + iVar16;
      local_150.tmp_width = dst_width2;
      local_150.tmp_height = local_190;
      local_150.tmp_stride = dst_stride2;
      local_150.mb_to_far_edge = (dcb->xd).mb_to_bottom_edge;
      iVar5 = max_neighbor_obmc[""[(*ppMVar25)->bsize]];
      uVar22 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
      lVar29 = (long)(dcb->xd).mi_stride * (long)(int)uVar27;
      iVar17 = (dcb->xd).height + uVar27;
      iVar26 = (cm->mi_params).mi_rows;
      if (iVar26 <= iVar17) {
        iVar17 = iVar26;
      }
      iVar26 = 0;
      uVar28 = uVar27;
      local_150.cm = cm;
      local_150.tmp_buf = dst_buf2;
      local_150.dcb = dcb;
      while (((int)uVar28 < iVar17 && (iVar26 < iVar5))) {
        iVar6 = (dcb->xd).mi_stride;
        pMVar24 = ppMVar25[((long)(int)(iVar6 * uVar28) + -1) - lVar29];
        uVar30 = (ulong)pMVar24->bsize;
        bVar14 = 0x10;
        uVar19 = uVar28;
        if ((0x2f0bffUL >> (uVar30 & 0x3f) & 1) != 0) {
          if ((0x20005UL >> (uVar30 & 0x3f) & 1) == 0) {
            bVar14 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar30];
          }
          else {
            uVar19 = uVar28 & 0xfffffffe;
            pMVar24 = ppMVar25[((long)(int)(iVar6 * (uVar28 | 1)) + -1) - lVar29];
            bVar14 = 2;
          }
        }
        if (((pMVar24->field_0xa7 & 0x80) != 0) || ('\0' < pMVar24->ref_frame[0])) {
          bVar20 = (dcb->xd).height;
          if (bVar14 <= bVar20) {
            bVar20 = bVar14;
          }
          iVar6 = (dcb->xd).mi_row;
          memcpy(local_e0,pMVar24,0xb0);
          av1_setup_build_prediction_by_left_pred
                    (&dcb->xd,uVar19 - uVar27,bVar20,(MB_MODE_INFO *)local_e0,&local_150,uVar22);
          iVar7 = (dcb->xd).mi_col;
          BVar3 = (*(dcb->xd).mi)->bsize;
          bVar4 = block_size_wide[BVar3];
          pmVar31 = planes;
          for (uVar30 = 0; uVar22 != uVar30; uVar30 = uVar30 + 1) {
            iVar8 = pmVar31->subsampling_x;
            iVar9 = pmVar31->subsampling_y;
            iVar12 = av1_skip_u4x4_pred_in_obmc(BVar3,pmVar31,1);
            if (iVar12 == 0) {
              bVar32 = (char)iVar8 + 1;
              uVar23 = (uint)(bVar4 >> (bVar32 & 0x1f));
              uVar28 = 0x40 >> (bVar32 & 0x1f);
              if (uVar23 < uVar28) {
                uVar28 = uVar23;
              }
              if (uVar23 < 4) {
                uVar28 = 4;
              }
              dec_build_inter_predictors
                        (local_150.cm,(DecoderCodingBlock *)local_150.dcb,(int)uVar30,
                         (MB_MODE_INFO *)local_e0,1,uVar28,
                         ((uint)bVar20 << 2) >> ((byte)iVar9 & 0x1f),iVar7 << 2,
                         (iVar6 + (uVar19 - uVar27)) * 4);
            }
            pmVar31 = pmVar31 + 1;
          }
          iVar26 = iVar26 + 1;
        }
        uVar28 = uVar19 + bVar14;
      }
      uVar27 = (dcb->xd).mi_row;
      (dcb->xd).mb_to_top_edge = uVar27 * -0x20;
      piVar1 = &(dcb->xd).mb_to_right_edge;
      *piVar1 = *piVar1 - iVar16;
      (dcb->xd).mb_to_bottom_edge = local_150.mb_to_far_edge;
      ppMVar25 = (dcb->xd).mi;
    }
    av1_setup_dst_planes
              (planes,(*ppMVar25)->bsize,&cm->cur_frame->buf,uVar27,(dcb->xd).mi_col,0,
               (uint)(uVar2 == '\0') * 2 + 1);
    av1_build_obmc_inter_prediction(cm,&dcb->xd,dst_buf1,dst_stride1,dst_buf2,dst_stride2);
  }
  return;
}

Assistant:

static inline void predict_inter_block(AV1_COMMON *const cm,
                                       DecoderCodingBlock *dcb,
                                       BLOCK_SIZE bsize) {
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    const MV_REFERENCE_FRAME frame = mbmi->ref_frame[ref];
    if (frame < LAST_FRAME) {
      assert(is_intrabc_block(mbmi));
      assert(frame == INTRA_FRAME);
      assert(ref == 0);
    } else {
      const RefCntBuffer *ref_buf = get_ref_frame_buf(cm, frame);
      const struct scale_factors *ref_scale_factors =
          get_ref_scale_factors_const(cm, frame);

      xd->block_ref_scale_factors[ref] = ref_scale_factors;
      av1_setup_pre_planes(xd, ref, &ref_buf->buf, mi_row, mi_col,
                           ref_scale_factors, num_planes);
    }
  }

  dec_build_inter_predictor(cm, dcb, mi_row, mi_col, bsize);
  if (mbmi->motion_mode == OBMC_CAUSAL) {
    dec_build_obmc_inter_predictors_sb(cm, dcb);
  }
#if CONFIG_MISMATCH_DEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    int pixel_c, pixel_r;
    mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0, pd->subsampling_x,
                    pd->subsampling_y);
    if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                             pd->subsampling_y))
      continue;
    mismatch_check_block_pre(pd->dst.buf, pd->dst.stride,
                             cm->current_frame.order_hint, plane, pixel_c,
                             pixel_r, pd->width, pd->height,
                             xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
  }
#endif
}